

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::GetArrayCopy<aiMeshMorphKey>(aiMeshMorphKey **dest,ai_uint num)

{
  undefined8 *puVar1;
  aiMeshMorphKey *__src;
  ulong *puVar2;
  aiMeshMorphKey *__dest;
  size_t sVar3;
  size_t __n;
  
  __src = *dest;
  if (__src != (aiMeshMorphKey *)0x0) {
    __n = (ulong)num * 0x20;
    puVar2 = (ulong *)operator_new__(__n + 8);
    *puVar2 = (ulong)num;
    __dest = (aiMeshMorphKey *)(puVar2 + 1);
    if (num != 0) {
      sVar3 = 0;
      do {
        puVar1 = (undefined8 *)((long)puVar2 + sVar3 + 0x14);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)&__dest->mTime + sVar3);
        *puVar1 = 0;
        puVar1[1] = 0;
        sVar3 = sVar3 + 0x20;
      } while (__n != sVar3);
    }
    *dest = __dest;
    memcpy(__dest,__src,__n);
    return;
  }
  return;
}

Assistant:

inline
void GetArrayCopy(Type*& dest, ai_uint num ) {
    if ( !dest ) {
        return;
    }
    Type* old = dest;

    dest = new Type[num];
    ::memcpy(dest, old, sizeof(Type) * num);
}